

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::AlpsNewCodepointTest_ClientDefaultServerExplicit_Test::
~AlpsNewCodepointTest_ClientDefaultServerExplicit_Test
          (AlpsNewCodepointTest_ClientDefaultServerExplicit_Test *this)

{
  (this->super_AlpsNewCodepointTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AlpsNewCodepointTest_0042f2f0;
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_AlpsNewCodepointTest).server_);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_AlpsNewCodepointTest).client_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_AlpsNewCodepointTest).server_ctx_);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            (&(this->super_AlpsNewCodepointTest).client_ctx_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(AlpsNewCodepointTest, ClientDefaultServerExplicit) {
  SetUpExpectedNewCodePoint(server_ctx_.get());

  ASSERT_TRUE(CreateClientAndServer(&client_, &server_, client_ctx_.get(),
                                    server_ctx_.get()));

  SSL_set_alps_use_new_codepoint(server_.get(), 1);

  SetUpApplicationSetting();
  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));
  ASSERT_TRUE(SSL_has_application_settings(client_.get()));
}